

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse2_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_diag_sse2_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  short sVar5;
  short sVar6;
  bool bVar7;
  short sVar8;
  bool bVar9;
  short sVar10;
  bool bVar11;
  short sVar12;
  uint a;
  unkbyte10 Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  uint uVar19;
  int iVar20;
  parasail_result_t *ppVar21;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar22;
  ulong uVar23;
  short sVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  undefined8 unaff_RBP;
  int iVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  int16_t iVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  uint uVar41;
  undefined4 uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  short sVar52;
  short sVar55;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar71 [16];
  ushort uVar72;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  undefined1 auVar73 [16];
  __m128i vMaxHCol;
  __m128i vMaxHRow;
  short local_218;
  short sStack_216;
  undefined1 local_208 [16];
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined1 local_198 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  long local_100;
  int *local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  short sVar61;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_table_diag_sse2_128_16_cold_7();
    return (parasail_result_t *)0x0;
  }
  uVar40 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sg_flags_table_diag_sse2_128_16_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_table_diag_sse2_128_16_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_table_diag_sse2_128_16_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_table_diag_sse2_128_16_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_table_diag_sse2_128_16_cold_2();
      return (parasail_result_t *)0x0;
    }
    uVar39 = (ulong)(uint)_s1Len;
    if (_s1Len < 1) {
      parasail_sg_flags_table_diag_sse2_128_16_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    uVar39 = (ulong)(uint)matrix->length;
  }
  a = (uint)uVar39;
  iVar18 = a + 7;
  uVar41 = s2Len + 7;
  iVar31 = -open;
  iVar20 = matrix->min;
  iVar28 = -iVar20;
  if (iVar20 != iVar31 && SBORROW4(iVar20,iVar31) == iVar20 + open < 0) {
    iVar28 = open;
  }
  uVar27 = iVar28 - 0x7fff;
  iVar20 = matrix->max;
  auVar43 = pshuflw(ZEXT416(uVar27),ZEXT416(uVar27),0);
  uVar42 = auVar43._0_4_;
  local_218 = auVar43._0_2_;
  sStack_216 = auVar43._2_2_;
  local_b8 = 0;
  local_178 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    auVar43 = pshuflw(ZEXT416((uint)(gap * 8)),ZEXT416((uint)(gap * 8)),0);
    local_b8 = auVar43._0_4_;
  }
  local_118._0_8_ = CONCAT26(sStack_216,CONCAT24(local_218,uVar42));
  local_118._8_8_ = CONCAT26(sStack_216,CONCAT24(local_218,uVar42));
  local_128._8_8_ = local_118._8_8_;
  local_128._0_8_ = local_118._0_8_;
  local_138._8_8_ = local_118._8_8_;
  local_138._0_8_ = local_118._0_8_;
  local_168._8_8_ = local_118._8_8_;
  local_168._0_8_ = local_118._0_8_;
  local_148._8_8_ = local_118._8_8_;
  local_148._0_8_ = local_118._0_8_;
  if (s1_beg == 0) {
    local_178._6_2_ = (short)(iVar31 + gap * -4);
    local_178._4_2_ = (short)(gap * 0xfffb - open);
    local_178._2_2_ = (short)(gap * 0xfffa - open);
    local_178._0_2_ = (short)(gap * 0xfff9 - open);
    local_178._10_2_ = (short)(iVar31 + gap * -2);
    local_178._8_2_ = (short)(gap * 0xfffd - open);
    local_178._14_2_ = (short)iVar31;
    local_178._12_2_ = (short)(iVar31 - gap);
  }
  uStack_b4 = local_b8;
  uStack_b0 = local_b8;
  uStack_ac = local_b8;
  ppVar21 = parasail_result_new_table1(a,s2Len);
  if (ppVar21 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar21->flag =
       (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
       (uint)(s2_end != 0) << 0xf | ppVar21->flag | 0x8221002;
  uVar29 = (ulong)(s2Len + 0xe);
  ptr = parasail_memalign_int16_t(0x10,uVar29);
  ptr_00 = parasail_memalign_int16_t(0x10,uVar29);
  ptr_01 = parasail_memalign_int16_t(0x10,uVar29);
  if (ptr_01 == (int16_t *)0x0 || (ptr_00 == (int16_t *)0x0 || ptr == (int16_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int16_t(0x10,(long)iVar18);
    if (ptr_02 == (int16_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < (int)a) {
      piVar1 = matrix->mapper;
      uVar29 = 0;
      do {
        ptr_02[uVar29] = (int16_t)piVar1[(byte)_s1[uVar29]];
        uVar29 = uVar29 + 1;
      } while (uVar39 != uVar29);
    }
    iVar28 = a + 1;
    if ((int)(a + 1) < iVar18) {
      iVar28 = iVar18;
    }
    memset(ptr_02 + (int)a,0,(ulong)(~a + iVar28) * 2 + 2);
  }
  else {
    ptr_02 = (int16_t *)0x0;
  }
  auVar43 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_RBP >> 0x10),0x7ffe - (short)iVar20));
  auVar43 = pshuflw(auVar43,auVar43,0);
  auVar46 = pshuflw(ZEXT416(a),ZEXT416(a),0);
  auVar48 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
  local_158._0_4_ = auVar43._0_4_;
  local_158._4_4_ = local_158._0_4_;
  local_158._8_4_ = local_158._0_4_;
  local_158._12_4_ = local_158._0_4_;
  auVar43 = pshuflw(local_158,ZEXT416((uint)open),0);
  auVar49 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)gap),0);
  local_48._0_4_ = auVar46._0_4_;
  local_48._4_4_ = local_48._0_4_;
  local_48._8_4_ = local_48._0_4_;
  local_48._12_4_ = local_48._0_4_;
  auVar46._8_4_ = 0xffffffff;
  auVar46._0_8_ = 0xffffffffffffffff;
  auVar46._12_4_ = 0xffffffff;
  local_68._0_4_ = auVar48._0_4_;
  local_68._4_4_ = local_68._0_4_;
  local_68._8_4_ = local_68._0_4_;
  local_68._12_4_ = local_68._0_4_;
  local_78 = auVar43._0_4_;
  local_88 = auVar49._0_4_;
  local_98 = paddsw(local_48,auVar46);
  local_58 = paddsw(auVar46,local_68);
  piVar1 = matrix->mapper;
  uVar29 = 1;
  if (1 < s2Len) {
    uVar29 = uVar40;
  }
  uVar30 = 0;
  do {
    ptr[uVar30 + 7] = (int16_t)piVar1[(byte)_s2[uVar30]];
    uVar30 = uVar30 + 1;
  } while (uVar29 != uVar30);
  ptr[3] = 0;
  ptr[4] = 0;
  ptr[5] = 0;
  ptr[6] = 0;
  ptr[0] = 0;
  ptr[1] = 0;
  ptr[2] = 0;
  ptr[3] = 0;
  uVar25 = s2Len + 1U;
  if ((int)(s2Len + 1U) < (int)uVar41) {
    uVar25 = uVar41;
  }
  uStack_84 = local_88;
  uStack_80 = local_88;
  uStack_7c = local_88;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  memset(ptr + uVar40 + 7,0,(ulong)(~s2Len + uVar25) * 2 + 2);
  uVar29 = 1;
  if (1 < s2Len) {
    uVar29 = uVar40;
  }
  iVar35 = (int16_t)uVar27;
  if (s2_beg == 0) {
    uVar30 = 0;
    iVar20 = iVar31;
    do {
      ptr_00[uVar30 + 7] = (int16_t)iVar20;
      iVar20 = iVar20 - gap;
      ptr_01[uVar30 + 7] = iVar35;
      uVar30 = uVar30 + 1;
    } while (uVar29 != uVar30);
  }
  else {
    uVar30 = 0;
    do {
      ptr_00[uVar30 + 7] = 0;
      ptr_01[uVar30 + 7] = iVar35;
      uVar30 = uVar30 + 1;
    } while (uVar29 != uVar30);
  }
  lVar22 = 0;
  do {
    ptr_00[lVar22] = iVar35;
    ptr_01[lVar22] = iVar35;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 7);
  lVar22 = uVar40 + 7;
  uVar29 = uVar40;
  do {
    ptr_00[lVar22] = iVar35;
    ptr_01[lVar22] = iVar35;
    lVar22 = lVar22 + 1;
    uVar25 = (int)uVar29 + 1;
    uVar29 = (ulong)uVar25;
  } while ((int)uVar25 < (int)uVar41);
  ptr_00[6] = 0;
  if ((int)a < 1) {
    local_198._4_2_ = local_218;
    local_198._0_4_ = uVar42;
    local_198._6_2_ = sStack_216;
    local_198._12_2_ = local_218;
    local_198._8_4_ = uVar42;
    local_198._14_2_ = sStack_216;
    local_1a8 = local_158._0_8_;
    uStack_1a0 = local_158._8_8_;
  }
  else {
    local_f8 = matrix->matrix;
    uVar25 = a - 1;
    Var13 = CONCAT28(local_218,CONCAT26(sStack_216,CONCAT24(local_218,uVar42)));
    auVar43._10_2_ = sStack_216;
    auVar43._0_10_ = Var13;
    auVar43._12_2_ = local_218;
    auVar43._14_2_ = sStack_216;
    local_a8 = auVar43 >> 0x10;
    auVar46 = local_a8;
    local_f0 = 1;
    if (1 < (int)uVar41) {
      local_f0 = (ulong)uVar41;
    }
    local_100 = uVar40 * 0x20;
    local_1b8 = uVar40 * 4 + -4;
    local_1c8 = uVar40 * 0x1c + -0x1c;
    local_1d0 = uVar40 * 0x18 + -0x18;
    local_1d8 = uVar40 * 0x14 + -0x14;
    local_1e0 = uVar40 * 8 + -8;
    local_1e8 = uVar40 * 0x10 + -0x10;
    local_1f0 = uVar40 * 0xc + -0xc;
    local_208._8_8_ = 0x100020003;
    local_208._0_8_ = 0x4000500060007;
    local_1c0 = 0;
    uVar29 = 0;
    local_1a8 = local_158._0_8_;
    uStack_1a0 = local_158._8_8_;
    local_198 = auVar43;
    do {
      iVar20 = matrix->type;
      uVar26 = (uint)uVar29;
      uVar41 = uVar26;
      if (iVar20 == 0) {
        uVar41 = (uint)ptr_02[uVar29];
      }
      uVar30 = uVar29 | 1;
      if (iVar20 == 0) {
        uVar33 = (int)ptr_02[uVar30];
      }
      else {
        uVar33 = uVar25;
        if (uVar30 < uVar39) {
          uVar33 = uVar26 | 1;
        }
      }
      local_c0 = uVar29 | 2;
      if (iVar20 == 0) {
        uVar36 = (int)ptr_02[local_c0];
      }
      else {
        uVar36 = uVar25;
        if (local_c0 < uVar39) {
          uVar36 = uVar26 | 2;
        }
      }
      local_c8 = uVar29 | 3;
      if (iVar20 == 0) {
        uVar37 = (int)ptr_02[local_c8];
      }
      else {
        uVar37 = uVar25;
        if (local_c8 < uVar39) {
          uVar37 = uVar26 | 3;
        }
      }
      local_d0 = uVar29 | 4;
      if (iVar20 == 0) {
        uVar38 = (int)ptr_02[local_d0];
      }
      else {
        uVar38 = uVar25;
        if (local_d0 < uVar39) {
          uVar38 = uVar26 | 4;
        }
      }
      local_d8 = uVar29 | 5;
      if (iVar20 == 0) {
        uVar34 = (int)ptr_02[local_d8];
      }
      else {
        uVar34 = uVar25;
        if (local_d8 < uVar39) {
          uVar34 = uVar26 | 5;
        }
      }
      local_e0 = uVar29 | 6;
      if (iVar20 == 0) {
        uVar32 = (int)ptr_02[local_e0];
      }
      else {
        uVar32 = uVar25;
        if (local_e0 < uVar39) {
          uVar32 = uVar26 | 6;
        }
      }
      iVar28 = matrix->size;
      local_e8 = uVar29 | 7;
      if (iVar20 == 0) {
        uVar19 = (int)ptr_02[local_e8];
      }
      else {
        uVar19 = uVar25;
        if (local_e8 < uVar39) {
          uVar19 = uVar26 | 7;
        }
      }
      uVar29 = uVar29 + 8;
      local_a8._0_8_ = (undefined8)((unkuint10)Var13 >> 0x10);
      local_a8._8_8_ = auVar43._8_8_ >> 0x10;
      auVar48._8_8_ = local_a8._8_8_ | (ulong)(ushort)ptr_00[6] << 0x30;
      auVar48._0_8_ = local_a8._0_8_;
      ptr_00[6] = (short)iVar31 - (short)uVar29 * (short)gap;
      uVar23 = (ulong)(iVar31 - uVar26 * gap);
      if (s1_beg != 0) {
        uVar23 = 0;
      }
      auVar71._8_8_ = local_a8._8_8_ | uVar23 << 0x30;
      auVar71._0_8_ = local_a8._0_8_;
      uVar23 = 0;
      auVar49._4_2_ = local_218;
      auVar49._0_4_ = uVar42;
      auVar49._6_2_ = sStack_216;
      auVar49._8_2_ = local_218;
      auVar49._10_2_ = sStack_216;
      auVar49._12_2_ = local_218;
      auVar49._14_2_ = sStack_216;
      auVar50 = _DAT_008d0b70;
      auVar58 = auVar49;
      do {
        auVar60._14_2_ = (short)local_f8[(long)(int)(uVar41 * iVar28) + (long)ptr[uVar23 + 7]];
        auVar60._12_2_ = (short)local_f8[(long)(int)(uVar33 * iVar28) + (long)ptr[uVar23 + 6]];
        auVar60._10_2_ = (short)local_f8[(long)(int)(uVar36 * iVar28) + (long)ptr[uVar23 + 5]];
        auVar60._8_2_ = (short)local_f8[(long)(int)(uVar37 * iVar28) + (long)ptr[uVar23 + 4]];
        auVar60._6_2_ = (short)local_f8[(long)(int)(uVar38 * iVar28) + (long)ptr[uVar23 + 3]];
        auVar60._4_2_ = (short)local_f8[(long)(int)(uVar34 * iVar28) + (long)ptr[uVar23 + 2]];
        auVar60._0_2_ = (undefined2)local_f8[(long)(int)(uVar19 * iVar28) + (long)ptr[uVar23]];
        auVar60._2_2_ = (short)local_f8[(long)(int)(uVar32 * iVar28) + (long)ptr[uVar23 + 1]];
        auVar59._0_8_ = auVar71._2_8_;
        auVar59._8_8_ = auVar71._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar23 + 7] << 0x30;
        auVar60 = paddsw(auVar60,auVar48);
        auVar51._0_8_ = auVar49._2_8_;
        auVar51._8_8_ = auVar49._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar23 + 7] << 0x30;
        auVar17._4_4_ = uStack_74;
        auVar17._0_4_ = local_78;
        auVar17._8_4_ = uStack_70;
        auVar17._12_4_ = uStack_6c;
        auVar48 = psubsw(auVar59,auVar17);
        auVar16._4_4_ = uStack_84;
        auVar16._0_4_ = local_88;
        auVar16._8_4_ = uStack_80;
        auVar16._12_4_ = uStack_7c;
        auVar49 = psubsw(auVar51,auVar16);
        sVar24 = auVar48._0_2_;
        sVar52 = auVar49._0_2_;
        auVar56._0_2_ = (ushort)(sVar52 < sVar24) * sVar24 | (ushort)(sVar52 >= sVar24) * sVar52;
        sVar24 = auVar48._2_2_;
        sVar52 = auVar49._2_2_;
        auVar56._2_2_ = (ushort)(sVar52 < sVar24) * sVar24 | (ushort)(sVar52 >= sVar24) * sVar52;
        sVar24 = auVar48._4_2_;
        sVar52 = auVar49._4_2_;
        auVar56._4_2_ = (ushort)(sVar52 < sVar24) * sVar24 | (ushort)(sVar52 >= sVar24) * sVar52;
        sVar24 = auVar48._6_2_;
        sVar52 = auVar49._6_2_;
        auVar56._6_2_ = (ushort)(sVar52 < sVar24) * sVar24 | (ushort)(sVar52 >= sVar24) * sVar52;
        sVar24 = auVar48._8_2_;
        sVar52 = auVar49._8_2_;
        auVar56._8_2_ = (ushort)(sVar52 < sVar24) * sVar24 | (ushort)(sVar52 >= sVar24) * sVar52;
        sVar24 = auVar48._10_2_;
        sVar52 = auVar49._10_2_;
        auVar56._10_2_ = (ushort)(sVar52 < sVar24) * sVar24 | (ushort)(sVar52 >= sVar24) * sVar52;
        sVar24 = auVar48._12_2_;
        sVar52 = auVar49._12_2_;
        sVar55 = auVar49._14_2_;
        auVar56._12_2_ = (ushort)(sVar52 < sVar24) * sVar24 | (ushort)(sVar52 >= sVar24) * sVar52;
        sVar24 = auVar48._14_2_;
        auVar56._14_2_ = (ushort)(sVar55 < sVar24) * sVar24 | (ushort)(sVar55 >= sVar24) * sVar55;
        auVar49 = psubsw(auVar71,auVar17);
        auVar48 = psubsw(auVar58,auVar16);
        sVar24 = auVar49._0_2_;
        sVar52 = auVar48._0_2_;
        auVar58._0_2_ = (ushort)(sVar52 < sVar24) * sVar24 | (ushort)(sVar52 >= sVar24) * sVar52;
        sVar24 = auVar49._2_2_;
        sVar52 = auVar48._2_2_;
        auVar58._2_2_ = (ushort)(sVar52 < sVar24) * sVar24 | (ushort)(sVar52 >= sVar24) * sVar52;
        sVar24 = auVar49._4_2_;
        sVar52 = auVar48._4_2_;
        auVar58._4_2_ = (ushort)(sVar52 < sVar24) * sVar24 | (ushort)(sVar52 >= sVar24) * sVar52;
        sVar24 = auVar49._6_2_;
        sVar52 = auVar48._6_2_;
        auVar58._6_2_ = (ushort)(sVar52 < sVar24) * sVar24 | (ushort)(sVar52 >= sVar24) * sVar52;
        sVar24 = auVar49._8_2_;
        sVar52 = auVar48._8_2_;
        auVar58._8_2_ = (ushort)(sVar52 < sVar24) * sVar24 | (ushort)(sVar52 >= sVar24) * sVar52;
        sVar24 = auVar49._10_2_;
        sVar52 = auVar48._10_2_;
        auVar58._10_2_ = (ushort)(sVar52 < sVar24) * sVar24 | (ushort)(sVar52 >= sVar24) * sVar52;
        sVar24 = auVar49._12_2_;
        sVar52 = auVar48._12_2_;
        sVar55 = auVar48._14_2_;
        auVar58._12_2_ = (ushort)(sVar52 < sVar24) * sVar24 | (ushort)(sVar52 >= sVar24) * sVar52;
        sVar24 = auVar49._14_2_;
        auVar58._14_2_ = (ushort)(sVar55 < sVar24) * sVar24 | (ushort)(sVar55 >= sVar24) * sVar55;
        uVar72 = ((short)auVar58._0_2_ < (short)auVar56._0_2_) * auVar56._0_2_ |
                 ((short)auVar58._0_2_ >= (short)auVar56._0_2_) * auVar58._0_2_;
        uVar74 = ((short)auVar58._2_2_ < (short)auVar56._2_2_) * auVar56._2_2_ |
                 ((short)auVar58._2_2_ >= (short)auVar56._2_2_) * auVar58._2_2_;
        uVar75 = ((short)auVar58._4_2_ < (short)auVar56._4_2_) * auVar56._4_2_ |
                 ((short)auVar58._4_2_ >= (short)auVar56._4_2_) * auVar58._4_2_;
        uVar76 = ((short)auVar58._6_2_ < (short)auVar56._6_2_) * auVar56._6_2_ |
                 ((short)auVar58._6_2_ >= (short)auVar56._6_2_) * auVar58._6_2_;
        uVar77 = ((short)auVar58._8_2_ < (short)auVar56._8_2_) * auVar56._8_2_ |
                 ((short)auVar58._8_2_ >= (short)auVar56._8_2_) * auVar58._8_2_;
        uVar78 = ((short)auVar58._10_2_ < (short)auVar56._10_2_) * auVar56._10_2_ |
                 ((short)auVar58._10_2_ >= (short)auVar56._10_2_) * auVar58._10_2_;
        uVar79 = ((short)auVar58._12_2_ < (short)auVar56._12_2_) * auVar56._12_2_ |
                 ((short)auVar58._12_2_ >= (short)auVar56._12_2_) * auVar58._12_2_;
        uVar80 = ((short)auVar58._14_2_ < (short)auVar56._14_2_) * auVar56._14_2_ |
                 ((short)auVar58._14_2_ >= (short)auVar56._14_2_) * auVar58._14_2_;
        sVar24 = auVar60._0_2_;
        auVar73._0_2_ =
             (ushort)((short)uVar72 < sVar24) * sVar24 | ((short)uVar72 >= sVar24) * uVar72;
        sVar24 = auVar60._2_2_;
        auVar73._2_2_ =
             (ushort)((short)uVar74 < sVar24) * sVar24 | ((short)uVar74 >= sVar24) * uVar74;
        sVar24 = auVar60._4_2_;
        auVar73._4_2_ =
             (ushort)((short)uVar75 < sVar24) * sVar24 | ((short)uVar75 >= sVar24) * uVar75;
        sVar24 = auVar60._6_2_;
        auVar73._6_2_ =
             (ushort)((short)uVar76 < sVar24) * sVar24 | ((short)uVar76 >= sVar24) * uVar76;
        sVar24 = auVar60._8_2_;
        auVar73._8_2_ =
             (ushort)((short)uVar77 < sVar24) * sVar24 | ((short)uVar77 >= sVar24) * uVar77;
        sVar24 = auVar60._10_2_;
        auVar73._10_2_ =
             (ushort)((short)uVar78 < sVar24) * sVar24 | ((short)uVar78 >= sVar24) * uVar78;
        sVar24 = auVar60._12_2_;
        auVar73._12_2_ =
             (ushort)((short)uVar79 < sVar24) * sVar24 | ((short)uVar79 >= sVar24) * uVar79;
        sVar24 = auVar60._14_2_;
        auVar73._14_2_ =
             (ushort)((short)uVar80 < sVar24) * sVar24 | ((short)uVar80 >= sVar24) * uVar80;
        sVar61 = auVar50._0_2_;
        auVar62._0_2_ = -(ushort)(sVar61 == -1);
        sVar64 = auVar50._2_2_;
        auVar62._2_2_ = -(ushort)(sVar64 == -1);
        sVar65 = auVar50._4_2_;
        auVar62._4_2_ = -(ushort)(sVar65 == -1);
        sVar66 = auVar50._6_2_;
        auVar62._6_2_ = -(ushort)(sVar66 == -1);
        sVar67 = auVar50._8_2_;
        auVar62._8_2_ = -(ushort)(sVar67 == -1);
        sVar68 = auVar50._10_2_;
        auVar62._10_2_ = -(ushort)(sVar68 == -1);
        sVar69 = auVar50._12_2_;
        sVar70 = auVar50._14_2_;
        auVar62._12_2_ = -(ushort)(sVar69 == -1);
        auVar62._14_2_ = -(ushort)(sVar70 == -1);
        auVar71 = local_178 & auVar62 | ~auVar62 & auVar73;
        sVar24 = auVar71._0_2_;
        sVar52 = auVar71._2_2_;
        sVar12 = auVar71._14_2_;
        sVar6 = auVar71._8_2_;
        sVar8 = auVar71._10_2_;
        sVar10 = auVar71._12_2_;
        sVar55 = auVar71._4_2_;
        sVar5 = auVar71._6_2_;
        if (7 < uVar23) {
          bVar2 = sVar24 < (short)local_1a8;
          uVar72 = (ushort)!bVar2 * (short)local_1a8;
          bVar3 = sVar52 < local_1a8._2_2_;
          uVar74 = (ushort)!bVar3 * local_1a8._2_2_;
          bVar4 = sVar55 < local_1a8._4_2_;
          uVar75 = (ushort)!bVar4 * local_1a8._4_2_;
          bVar7 = sVar6 < (short)uStack_1a0;
          uVar76 = (ushort)!bVar7 * (short)uStack_1a0;
          bVar9 = sVar8 < uStack_1a0._2_2_;
          uVar77 = (ushort)!bVar9 * uStack_1a0._2_2_;
          bVar11 = sVar10 < uStack_1a0._4_2_;
          uVar78 = (ushort)!bVar11 * uStack_1a0._4_2_;
          local_1a8 = CONCAT26((ushort)(sVar5 < local_1a8._6_2_) * sVar5 |
                               (ushort)(sVar5 >= local_1a8._6_2_) * local_1a8._6_2_,
                               CONCAT24((ushort)bVar4 * sVar55 | uVar75,
                                        CONCAT22((ushort)bVar3 * sVar52 | uVar74,
                                                 (ushort)bVar2 * sVar24 | uVar72)));
          uStack_1a0 = CONCAT26((ushort)(sVar12 < uStack_1a0._6_2_) * sVar12 |
                                (ushort)(sVar12 >= uStack_1a0._6_2_) * uStack_1a0._6_2_,
                                CONCAT24((ushort)bVar11 * sVar10 | uVar78,
                                         CONCAT22((ushort)bVar9 * sVar8 | uVar77,
                                                  (ushort)bVar7 * sVar6 | uVar76)));
          local_198._2_2_ =
               (ushort)((short)local_198._2_2_ < sVar52) * sVar52 |
               (ushort)((short)local_198._2_2_ >= sVar52) * local_198._2_2_;
          local_198._0_2_ =
               (ushort)((short)local_198._0_2_ < sVar24) * sVar24 |
               (ushort)((short)local_198._0_2_ >= sVar24) * local_198._0_2_;
          local_198._4_2_ =
               (ushort)((short)local_198._4_2_ < sVar55) * sVar55 |
               (ushort)((short)local_198._4_2_ >= sVar55) * local_198._4_2_;
          local_198._6_2_ =
               (ushort)((short)local_198._6_2_ < sVar5) * sVar5 |
               (ushort)((short)local_198._6_2_ >= sVar5) * local_198._6_2_;
          local_198._8_2_ =
               (ushort)((short)local_198._8_2_ < sVar6) * sVar6 |
               (ushort)((short)local_198._8_2_ >= sVar6) * local_198._8_2_;
          local_198._10_2_ =
               (ushort)((short)local_198._10_2_ < sVar8) * sVar8 |
               (ushort)((short)local_198._10_2_ >= sVar8) * local_198._10_2_;
          local_198._12_2_ =
               (ushort)((short)local_198._12_2_ < sVar10) * sVar10 |
               (ushort)((short)local_198._12_2_ >= sVar10) * local_198._12_2_;
          local_198._14_2_ =
               (ushort)((short)local_198._14_2_ < sVar12) * sVar12 |
               (ushort)((short)local_198._14_2_ >= sVar12) * local_198._14_2_;
        }
        piVar1 = ((ppVar21->field_4).rowcols)->score_row;
        if (uVar23 < uVar40) {
          *(int *)((long)piVar1 + uVar23 * 4 + local_1c0) = (int)sVar12;
        }
        if (uVar23 - 1 < uVar40 && uVar30 < uVar39) {
          *(int *)((long)piVar1 + uVar23 * 4 + local_1b8) = (int)sVar10;
        }
        if ((local_c0 < uVar39) && ((long)(uVar23 - 2) < (long)uVar40 && 1 < uVar23)) {
          *(int *)((long)piVar1 + uVar23 * 4 + local_1e0) = (int)sVar8;
        }
        if ((local_c8 < uVar39) && ((long)(uVar23 - 3) < (long)uVar40 && 2 < uVar23)) {
          *(int *)((long)piVar1 + uVar23 * 4 + local_1f0) = (int)sVar6;
        }
        if ((local_d0 < uVar39) && ((long)(uVar23 - 4) < (long)uVar40 && 3 < uVar23)) {
          *(int *)((long)piVar1 + uVar23 * 4 + local_1e8) = (int)sVar5;
        }
        if ((local_d8 < uVar39) && ((long)(uVar23 - 5) < (long)uVar40 && 4 < uVar23)) {
          *(int *)((long)piVar1 + uVar23 * 4 + local_1d8) = (int)sVar55;
        }
        if ((local_e0 < uVar39) && ((long)(uVar23 - 6) < (long)uVar40 && 5 < uVar23)) {
          *(int *)((long)piVar1 + uVar23 * 4 + local_1d0) = (int)sVar52;
        }
        auVar14._4_2_ = local_218;
        auVar14._0_4_ = uVar42;
        auVar14._6_2_ = sStack_216;
        auVar14._8_2_ = local_218;
        auVar14._10_2_ = sStack_216;
        auVar14._12_2_ = local_218;
        auVar14._14_2_ = sStack_216;
        auVar49 = ~auVar62 & auVar56 | auVar14 & auVar62;
        if ((local_e8 < uVar39) && ((long)(uVar23 - 7) < (long)uVar40 && 6 < uVar23)) {
          *(int *)((long)piVar1 + uVar23 * 4 + local_1c8) = (int)sVar24;
        }
        auVar58 = auVar14 & auVar62 | ~auVar62 & auVar58;
        auVar53._0_2_ = -(ushort)((short)local_208._0_2_ < (short)local_48._0_2_);
        auVar53._2_2_ = -(ushort)((short)local_208._2_2_ < (short)local_48._2_2_);
        auVar53._4_2_ = -(ushort)((short)local_208._4_2_ < (short)local_48._4_2_);
        auVar53._6_2_ = -(ushort)((short)local_208._6_2_ < (short)local_48._6_2_);
        auVar53._8_2_ = -(ushort)((short)local_208._8_2_ < (short)local_48._8_2_);
        auVar53._10_2_ = -(ushort)((short)local_208._10_2_ < (short)local_48._10_2_);
        auVar53._12_2_ = -(ushort)((short)local_208._12_2_ < (short)local_48._12_2_);
        auVar53._14_2_ = -(ushort)((short)local_208._14_2_ < (short)local_48._14_2_);
        ptr_00[uVar23] = sVar24;
        ptr_01[uVar23] = auVar49._0_2_;
        auVar63._0_2_ = -(ushort)(local_58._0_2_ == sVar61);
        auVar63._2_2_ = -(ushort)(local_58._2_2_ == sVar64);
        auVar63._4_2_ = -(ushort)(local_58._4_2_ == sVar65);
        auVar63._6_2_ = -(ushort)(local_58._6_2_ == sVar66);
        auVar63._8_2_ = -(ushort)(local_58._8_2_ == sVar67);
        auVar63._10_2_ = -(ushort)(local_58._10_2_ == sVar68);
        auVar63._12_2_ = -(ushort)(local_58._12_2_ == sVar69);
        auVar63._14_2_ = -(ushort)(local_58._14_2_ == sVar70);
        auVar44._0_2_ = -(ushort)(sVar61 < (short)local_68._0_2_);
        auVar44._2_2_ = -(ushort)(sVar64 < (short)local_68._2_2_);
        auVar44._4_2_ = -(ushort)(sVar65 < (short)local_68._4_2_);
        auVar44._6_2_ = -(ushort)(sVar66 < (short)local_68._6_2_);
        auVar44._8_2_ = -(ushort)(sVar67 < (short)local_68._8_2_);
        auVar44._10_2_ = -(ushort)(sVar68 < (short)local_68._10_2_);
        auVar44._12_2_ = -(ushort)(sVar69 < (short)local_68._12_2_);
        auVar44._14_2_ = -(ushort)(sVar70 < (short)local_68._14_2_);
        auVar57._0_2_ = -(ushort)(local_118._0_2_ < sVar24);
        auVar57._2_2_ = -(ushort)(local_118._2_2_ < sVar52);
        auVar57._4_2_ = -(ushort)(local_118._4_2_ < sVar55);
        auVar57._6_2_ = -(ushort)(local_118._6_2_ < sVar5);
        auVar57._8_2_ = -(ushort)(local_118._8_2_ < sVar6);
        auVar57._10_2_ = -(ushort)(local_118._10_2_ < sVar8);
        auVar57._12_2_ = -(ushort)(local_118._12_2_ < sVar10);
        auVar57._14_2_ = -(ushort)(local_118._14_2_ < sVar12);
        auVar48 = psraw(auVar50,0xf);
        auVar15._2_2_ = -(ushort)(local_98._2_2_ == local_208._2_2_);
        auVar15._0_2_ = -(ushort)(local_98._0_2_ == local_208._0_2_);
        auVar15._4_2_ = -(ushort)(local_98._4_2_ == local_208._4_2_);
        auVar15._6_2_ = -(ushort)(local_98._6_2_ == local_208._6_2_);
        auVar15._8_2_ = -(ushort)(local_98._8_2_ == local_208._8_2_);
        auVar15._10_2_ = -(ushort)(local_98._10_2_ == local_208._10_2_);
        auVar15._12_2_ = -(ushort)(local_98._12_2_ == local_208._12_2_);
        auVar15._14_2_ = -(ushort)(local_98._14_2_ == local_208._14_2_);
        auVar57 = ~auVar48 & auVar44 & auVar15 & auVar57;
        auVar54._0_2_ = -(ushort)(local_128._0_2_ < sVar24);
        auVar54._2_2_ = -(ushort)(local_128._2_2_ < sVar52);
        auVar54._4_2_ = -(ushort)(local_128._4_2_ < sVar55);
        auVar54._6_2_ = -(ushort)(local_128._6_2_ < sVar5);
        auVar54._8_2_ = -(ushort)(local_128._8_2_ < sVar6);
        auVar54._10_2_ = -(ushort)(local_128._10_2_ < sVar8);
        auVar54._12_2_ = -(ushort)(local_128._12_2_ < sVar10);
        auVar54._14_2_ = -(ushort)(local_128._14_2_ < sVar12);
        auVar54 = auVar53 & auVar63 & auVar54;
        local_118 = auVar73 & auVar57 | ~auVar57 & local_118;
        local_128 = auVar71 & auVar54 | ~auVar54 & local_128;
        local_138 = ~(auVar63 & auVar15) & local_138 | auVar71 & auVar63 & auVar15;
        local_168 = ~auVar54 & local_168 | local_208 & auVar54;
        local_148 = ~auVar57 & local_148 | auVar50 & auVar57;
        auVar50 = paddsw(auVar50,_DAT_008d0b80);
        uVar23 = uVar23 + 1;
        auVar48 = auVar59;
      } while (local_f0 != uVar23);
      local_208 = paddsw(local_208,_DAT_008d0b90);
      auVar50._4_4_ = uStack_b4;
      auVar50._0_4_ = local_b8;
      auVar50._8_4_ = uStack_b0;
      auVar50._12_4_ = uStack_ac;
      local_178 = psubsw(local_178,auVar50);
      local_1c0 = local_1c0 + local_100;
      local_1b8 = local_1b8 + local_100;
      local_1c8 = local_1c8 + local_100;
      local_1d0 = local_1d0 + local_100;
      local_1d8 = local_1d8 + local_100;
      local_1e8 = local_1e8 + local_100;
      local_1f0 = local_1f0 + local_100;
      local_1e0 = local_1e0 + local_100;
      local_a8 = auVar46;
    } while (uVar29 < uVar39);
  }
  lVar22 = 0;
  iVar28 = 0;
  iVar20 = 0;
  uVar41 = uVar27;
  uVar25 = uVar27;
  do {
    uVar72 = *(ushort *)(local_128 + lVar22 * 2);
    if (((short)(ushort)uVar41 < (short)uVar72) ||
       ((uVar72 == (ushort)uVar41 && (*(short *)(local_168 + lVar22 * 2) < iVar28)))) {
      iVar28 = (int)*(short *)(local_168 + lVar22 * 2);
      uVar41 = (uint)uVar72;
    }
    sVar24 = (short)uVar41;
    if ((short)uVar25 < (short)*(ushort *)(local_118 + lVar22 * 2)) {
      iVar20 = (int)*(short *)(local_148 + lVar22 * 2);
      uVar25 = (uint)*(ushort *)(local_118 + lVar22 * 2);
    }
    sVar52 = (short)uVar25;
    uVar26 = (uint)*(ushort *)(local_138 + lVar22 * 2);
    if ((short)*(ushort *)(local_138 + lVar22 * 2) <= (short)uVar27) {
      uVar26 = uVar27;
    }
    uVar27 = uVar26;
    lVar22 = lVar22 + 1;
  } while ((int)lVar22 != 8);
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end == 0) {
      iVar28 = a - 1;
      iVar18 = s2Len + -1;
      sVar24 = (short)uVar27;
      if (s2_end != 0) {
        iVar18 = iVar20;
        sVar24 = sVar52;
      }
      goto LAB_005ad961;
    }
  }
  else if ((sVar24 <= sVar52) && ((sVar24 != sVar52 || (iVar20 != s2Len + -1)))) {
    iVar28 = a - 1;
    iVar18 = iVar20;
    sVar24 = sVar52;
    goto LAB_005ad961;
  }
  iVar18 = s2Len + -1;
LAB_005ad961:
  auVar45._0_2_ = -(ushort)((short)local_1a8 < local_218);
  auVar45._2_2_ = -(ushort)(local_1a8._2_2_ < sStack_216);
  auVar45._4_2_ = -(ushort)(local_1a8._4_2_ < local_218);
  auVar45._6_2_ = -(ushort)(local_1a8._6_2_ < sStack_216);
  auVar45._8_2_ = -(ushort)((short)uStack_1a0 < local_218);
  auVar45._10_2_ = -(ushort)(uStack_1a0._2_2_ < sStack_216);
  auVar45._12_2_ = -(ushort)(uStack_1a0._4_2_ < local_218);
  auVar45._14_2_ = -(ushort)(uStack_1a0._6_2_ < sStack_216);
  auVar47._0_2_ = -(ushort)((short)local_158._0_2_ < (short)local_198._0_2_);
  auVar47._2_2_ = -(ushort)((short)local_158._2_2_ < (short)local_198._2_2_);
  auVar47._4_2_ = -(ushort)((short)local_158._4_2_ < (short)local_198._4_2_);
  auVar47._6_2_ = -(ushort)((short)local_158._6_2_ < (short)local_198._6_2_);
  auVar47._8_2_ = -(ushort)((short)local_158._8_2_ < (short)local_198._8_2_);
  auVar47._10_2_ = -(ushort)((short)local_158._10_2_ < (short)local_198._10_2_);
  auVar47._12_2_ = -(ushort)((short)local_158._12_2_ < (short)local_198._12_2_);
  auVar47._14_2_ = -(ushort)((short)local_158._14_2_ < (short)local_198._14_2_);
  auVar47 = auVar47 | auVar45;
  if ((((((((((((((((auVar47 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar47 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar47 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar47 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar47 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar47 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar47 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar47 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar47 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar47 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar47 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar47 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar47[0xf] < '\0') {
    *(byte *)&ppVar21->flag = (byte)ppVar21->flag | 0x40;
    sVar24 = 0;
    iVar18 = 0;
    iVar28 = 0;
  }
  ppVar21->score = (int)sVar24;
  ppVar21->end_query = iVar28;
  ppVar21->end_ref = iVar18;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar21;
  }
  return ppVar21;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = s1_beg ? _mm_set1_epi16(0) : _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi16(0) : _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi16(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, s1_beg ? 0 : (-open - i*gap), 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi16(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi16(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi16(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi16(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8_rpl(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8_rpl(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8_rpl(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int16_t max_row = NEG_LIMIT;
        int16_t max_col = NEG_LIMIT;
        int16_t last_val = NEG_LIMIT;
        int16_t *s = (int16_t*)&vMaxHRow;
        int16_t *t = (int16_t*)&vMaxHCol;
        int16_t *u = (int16_t*)&vLastVal;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}